

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_base.h
# Opt level: O1

void mp::
     WriteJSON<mp::MiniJSONWriter<fmt::BasicMemoryWriter<char,std::allocator<char>>>,mp::AlgebraicConstraint<mp::LinTerms,mp::AlgConRhs<1>>>
               (MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_> *jw,
               ConditionalConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<1>_>_>
               *condc)

{
  uint uVar1;
  string_view key;
  string_view key_00;
  MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_> local_58;
  MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_> local_48;
  ulong local_38 [3];
  
  uVar1 = (condc->
          super_CustomFunctionalConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<1>_>,_std::array<int,_0UL>,_mp::LogicalFunctionalConstraintTraits,_mp::CondConId<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<1>_>_>_>
          ).super_FunctionalConstraint.result_var_;
  key._M_str = (char *)0x7;
  key._M_len = (size_t)jw;
  MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::operator[](&local_58,key);
  if (local_58.kind_ == Unset) {
    local_58.kind_ = Scalar;
  }
  local_38[0] = (ulong)uVar1;
  fmt::BasicWriter<char>::write
            (&(local_58.wrt_)->super_BasicWriter<char>,0x4b9e95,(void *)0x2,(size_t)local_38);
  local_58.n_written_ = local_58.n_written_ + 1;
  MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::Close(&local_58);
  MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::Close(&local_58);
  key_00._M_str = (char *)0x3;
  key_00._M_len = (size_t)jw;
  MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::operator[](&local_48,key_00)
  ;
  WriteJSON<mp::LinTerms,mp::AlgConRhs<1>>
            (&local_48,
             &(condc->
              super_CustomFunctionalConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<1>_>,_std::array<int,_0UL>,_mp::LogicalFunctionalConstraintTraits,_mp::CondConId<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<1>_>_>_>
              ).
              super_CustomConstraintData<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<1>_>,_std::array<int,_0UL>,_mp::CondConId<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<1>_>_>_>
              .args_);
  MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::Close(&local_48);
  return;
}

Assistant:

inline void WriteJSON(JW jw,
                      const ConditionalConstraint<Con>& condc) {
  jw["res_var"] = condc.GetResultVar();
  WriteJSON(jw["con"], condc.GetConstraint());
}